

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSAttribute.cpp
# Opt level: O0

void __thiscall
OSAttribute::OSAttribute
          (OSAttribute *this,
          set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *value)

{
  undefined8 *in_RDI;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffffb8;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *this_00;
  
  *in_RDI = &PTR__OSAttribute_00220588;
  this_00 = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
            (in_RDI + 3);
  ByteString::ByteString((ByteString *)0x1db1a0);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             0x1db1b3);
  std::
  map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
  ::map((map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
         *)0x1db1c6);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::operator=
            (this_00,in_stack_ffffffffffffffb8);
  *(undefined4 *)(in_RDI + 1) = 3;
  *(undefined1 *)((long)in_RDI + 0xc) = 0;
  in_RDI[2] = 0;
  return;
}

Assistant:

OSAttribute::OSAttribute(const std::set<CK_MECHANISM_TYPE>& value)
{
	mechSetValue = value;
	attributeType = MECHSET;

	boolValue = false;
	ulongValue = 0;
}